

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O0

void __thiscall TestSchema::checkNameLookup(TestSchema *this)

{
  byte bVar1;
  bool bVar2;
  type pNVar3;
  type pNVar4;
  ValidSchema *in_RDI;
  NodePtr enumNode;
  bool found;
  size_t index;
  NodePtr node;
  shared_ptr<avro::Node> *in_stack_fffffffffffff948;
  char *r;
  basic_cstring<const_char> *in_stack_fffffffffffff950;
  char *in_stack_fffffffffffff958;
  allocator<char> *in_stack_fffffffffffff980;
  allocator<char> *__a;
  const_string *in_stack_fffffffffffff988;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *msg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff990;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined7 in_stack_fffffffffffff998;
  undefined1 in_stack_fffffffffffff99f;
  unit_test_log_t *in_stack_fffffffffffff9a0;
  undefined1 local_579 [17];
  undefined1 local_568 [56];
  basic_cstring<const_char> local_530;
  allocator<char> local_519;
  string local_518 [36];
  undefined1 local_4f4 [20];
  undefined1 local_4e0 [56];
  basic_cstring<const_char> local_4a8;
  undefined1 local_491 [17];
  undefined1 local_480 [56];
  basic_cstring<const_char> local_448;
  allocator<char> local_431;
  string local_430 [36];
  undefined1 local_40c [20];
  undefined1 local_3f8 [56];
  basic_cstring<const_char> local_3c0;
  undefined1 local_3a9 [17];
  undefined1 local_398 [56];
  basic_cstring<const_char> local_360;
  allocator<char> local_349;
  string local_348 [32];
  shared_ptr<avro::Node> local_328;
  undefined1 local_311 [17];
  undefined1 local_300 [56];
  basic_cstring<const_char> local_2c8;
  allocator<char> local_2b1;
  string local_2b0 [36];
  undefined1 local_28c [20];
  undefined1 local_278 [56];
  basic_cstring<const_char> local_240;
  undefined1 local_229 [17];
  undefined1 local_218 [56];
  basic_cstring<const_char> local_1e0;
  allocator<char> local_1c9;
  string local_1c8 [36];
  undefined1 local_1a4 [20];
  undefined1 local_190 [56];
  basic_cstring<const_char> local_158;
  undefined1 local_141 [17];
  undefined1 local_130 [56];
  basic_cstring<const_char> local_f8;
  allocator<char> local_e1;
  string local_e0 [39];
  undefined1 local_b9 [17];
  undefined1 local_a8 [56];
  basic_cstring<const_char> local_70 [2];
  allocator<char> local_49;
  string local_48 [39];
  byte local_21;
  ulong local_20;
  shared_ptr<avro::Node> local_18;
  
  avro::ValidSchema::root(in_RDI);
  boost::shared_ptr<avro::Node>::shared_ptr
            ((shared_ptr<avro::Node> *)in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  local_20 = 0;
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  bVar1 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_48,&local_20);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_49);
  local_21 = bVar1 & 1;
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (local_70,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_b9 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_b9[0] = 0;
    in_stack_fffffffffffff958 = "false";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_b9;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_a8,local_b9 + 1,0x8c,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a0ca);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_21 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_e0,&local_20);
  local_21 = local_21 & 1;
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator(&local_e1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_f8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_141 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_141[0] = 1;
    in_stack_fffffffffffff958 = "true";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_141;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_130,local_141 + 1,0x8f,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a271);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_158,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_1a4 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_1a4._0_4_ = 0;
    in_stack_fffffffffffff958 = "0U";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_1a4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_190,local_1a4 + 4,0x90,1,2,&local_20,"index");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a381);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_21 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_1c8,&local_20);
  local_21 = local_21 & 1;
  std::__cxx11::string::~string(local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_1e0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_229 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_229[0] = 1;
    in_stack_fffffffffffff958 = "true";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_229;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_218,local_229 + 1,0x93,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a528);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_240,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_28c + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_28c._0_4_ = 8;
    in_stack_fffffffffffff958 = "8U";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_28c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_278,local_28c + 4,0x94,1,2,&local_20,"index");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a638);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_21 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_2b0,&local_20);
  local_21 = local_21 & 1;
  std::__cxx11::string::~string(local_2b0);
  std::allocator<char>::~allocator(&local_2b1);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_2c8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_311 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_311[0] = 1;
    in_stack_fffffffffffff958 = "true";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_311;
    r = "found";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_300,local_311 + 1,0x97,1,2,&local_21);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a7df);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_18);
  (**(code **)(*(long *)pNVar3 + 0x28))(pNVar3,local_20 & 0xffffffff);
  boost::shared_ptr<avro::Node>::shared_ptr
            ((shared_ptr<avro::Node> *)in_stack_fffffffffffff950,(shared_ptr<avro::Node> *)r);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  local_21 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_348,&local_20);
  local_21 = local_21 & 1;
  std::__cxx11::string::~string(local_348);
  std::allocator<char>::~allocator(&local_349);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_360,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_3a9 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_3a9[0] = 1;
    in_stack_fffffffffffff958 = "true";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_3a9;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_398,local_3a9 + 1,0x9b,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29a9c1);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_3c0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffff9a0,
               (const_string *)CONCAT17(in_stack_fffffffffffff99f,in_stack_fffffffffffff998),
               (size_t)in_stack_fffffffffffff990,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_40c + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_40c._0_4_ = 1;
    in_stack_fffffffffffff958 = "1U";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_40c;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_3f8,local_40c + 4,0x9c,1,2,&local_20,"index");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29aacb);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar3 = boost::shared_ptr<avro::Node>::operator->(&local_328);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff990,(char *)in_stack_fffffffffffff988,in_stack_fffffffffffff980);
  bVar1 = (**(code **)(*(long *)pNVar3 + 0x48))(pNVar3,local_430,&local_20);
  local_21 = bVar1 & 1;
  std::__cxx11::string::~string(local_430);
  std::allocator<char>::~allocator(&local_431);
  do {
    this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_448,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pNVar3,(const_string *)CONCAT17(bVar1,in_stack_fffffffffffff998),
               (size_t)this_00,in_stack_fffffffffffff988);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_491 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_491[0] = 1;
    in_stack_fffffffffffff958 = "true";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_491;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_480,local_491 + 1,0x9f,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29ac5a);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    msg = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_4a8,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pNVar3,(const_string *)CONCAT17(bVar1,in_stack_fffffffffffff998),
               (size_t)this_00,(const_string *)msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_4f4 + 4),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_4f4._0_4_ = 3;
    in_stack_fffffffffffff958 = "3U";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_4f4;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (local_4e0,local_4f4 + 4,0xa0,1,2,&local_20,"index");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29ad64);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  pNVar4 = boost::shared_ptr<avro::Node>::operator->(&local_328);
  __a = &local_519;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(this_00,(char *)msg,__a);
  local_21 = (**(code **)(*(long *)pNVar4 + 0x48))(pNVar4,local_518,&local_20);
  local_21 = local_21 & 1;
  std::__cxx11::string::~string(local_518);
  std::allocator<char>::~allocator(&local_519);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              (&local_530,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    boost::unit_test::basic_cstring<const_char>::basic_cstring(in_stack_fffffffffffff950);
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)pNVar3,(const_string *)CONCAT17(bVar1,in_stack_fffffffffffff998),
               (size_t)this_00,(const_string *)msg);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffff958,(char (*) [1])in_stack_fffffffffffff950);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)(local_579 + 1),
               "/workspace/llm4binary/github/license_all_cmakelists_1510/confluentinc[P]avro-cpp-packaging/test/unittest.cc"
               ,0x6b);
    local_579[0] = 0;
    in_stack_fffffffffffff958 = "false";
    in_stack_fffffffffffff950 = (basic_cstring<const_char> *)local_579;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,bool,bool>
              (local_568,local_579 + 1,0xa3,1,2,&local_21,"found");
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               0x29aef3);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x29af0d);
  boost::shared_ptr<avro::Node>::~shared_ptr((shared_ptr<avro::Node> *)0x29af1a);
  return;
}

Assistant:

void checkNameLookup() {
        NodePtr node = schema_.root();

        size_t index = 0;
        bool found = node->nameIndex("mylongxxx", index);
        BOOST_CHECK_EQUAL(found, false);

        found = node->nameIndex("mylong", index);
        BOOST_CHECK_EQUAL(found, true);
        BOOST_CHECK_EQUAL(index, 0U);

        found = node->nameIndex("mylong2", index);
        BOOST_CHECK_EQUAL(found, true);
        BOOST_CHECK_EQUAL(index, 8U);

        found = node->nameIndex("myenum", index);
        BOOST_CHECK_EQUAL(found, true);
        NodePtr enumNode = node->leafAt(index);

        found = enumNode->nameIndex("one", index);
        BOOST_CHECK_EQUAL(found, true);
        BOOST_CHECK_EQUAL(index, 1U);

        found = enumNode->nameIndex("three", index);
        BOOST_CHECK_EQUAL(found, true);
        BOOST_CHECK_EQUAL(index, 3U);

        found = enumNode->nameIndex("four", index);
        BOOST_CHECK_EQUAL(found, false);
    }